

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DWARFAcceleratorTable.cpp
# Opt level: O3

Optional<llvm::dwarf::Tag> __thiscall llvm::AppleAcceleratorTable::Entry::getTag(Entry *this)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  Optional<unsigned_long> OVar4;
  undefined1 local_50 [8];
  Optional<llvm::DWARFFormValue> Tag;
  
  lookup((Optional<llvm::DWARFFormValue> *)local_50,this,3);
  uVar2 = 0;
  if (Tag.Storage.field_0._40_1_ == '\x01') {
    OVar4 = DWARFFormValue::getAsUnsignedConstant((DWARFFormValue *)local_50);
    uVar3 = 0;
    uVar1 = 0;
    if (((undefined1  [16])OVar4.Storage & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
      uVar1 = OVar4.Storage.field_0._0_4_ & 0xff00;
      uVar3 = (uint)OVar4.Storage.field_0._0_1_;
      uVar2 = 0x10000;
    }
  }
  else {
    uVar3 = 0;
    uVar1 = 0;
  }
  return (Optional<llvm::dwarf::Tag>)
         (OptionalStorage<llvm::dwarf::Tag,_true>)(uVar2 | uVar3 | uVar1);
}

Assistant:

Optional<dwarf::Tag> AppleAcceleratorTable::Entry::getTag() const {
  Optional<DWARFFormValue> Tag = lookup(dwarf::DW_ATOM_die_tag);
  if (!Tag)
    return None;
  if (Optional<uint64_t> Value = Tag->getAsUnsignedConstant())
    return dwarf::Tag(*Value);
  return None;
}